

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-customop.c
# Opt level: O1

void custom1(ggml_tensor *dst,ggml_tensor *a,int ith,int nth,void *userdata)

{
  float fVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  char *pcVar8;
  int iVar9;
  undefined8 uVar10;
  
  if (userdata == (void *)0x0) {
    cVar2 = ggml_are_same_shape();
    if (cVar2 == '\0') {
      pcVar8 = "ggml_are_same_shape(dst, a)";
      uVar10 = 0x27;
    }
    else {
      LOCK();
      g_custom1_count = g_custom1_count + 1;
      UNLOCK();
      lVar5 = ggml_get_data_f32(a);
      lVar6 = ggml_get_data_f32(dst);
      cVar2 = ggml_is_contiguous(dst);
      if (cVar2 == '\0') {
        pcVar8 = "ggml_is_contiguous(dst)";
        uVar10 = 0x2f;
      }
      else {
        cVar2 = ggml_is_contiguous(a);
        if (cVar2 != '\0') {
          iVar3 = ggml_nelements(dst);
          iVar4 = (iVar3 + nth + -1) / nth;
          iVar9 = ith * iVar4;
          iVar4 = iVar4 + iVar9;
          if (iVar3 <= iVar4) {
            iVar4 = iVar3;
          }
          if (iVar9 < iVar4) {
            lVar7 = (long)iVar9;
            do {
              fVar1 = *(float *)(lVar5 + lVar7 * 4);
              *(float *)(lVar6 + lVar7 * 4) = fVar1 + fVar1;
              lVar7 = lVar7 + 1;
            } while (iVar4 != lVar7);
          }
          return;
        }
        pcVar8 = "ggml_is_contiguous(a)";
        uVar10 = 0x30;
      }
    }
  }
  else {
    pcVar8 = "userdata == NULL";
    uVar10 = 0x26;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-customop.c"
             ,uVar10,"GGML_ASSERT(%s) failed",pcVar8);
  return;
}

Assistant:

void custom1(struct ggml_tensor * dst , const struct ggml_tensor * a, int ith, int nth, void * userdata) {
    // check that the userdata is correct
    GGML_ASSERT(userdata == NULL);
    GGML_ASSERT(ggml_are_same_shape(dst, a));

    atomic_fetch_add(&g_custom1_count, 1);

    const float * a_data = ggml_get_data_f32(a);
    float * dst_data = ggml_get_data_f32(dst);

    // this assumes that the tensors are contiguous
    GGML_ASSERT(ggml_is_contiguous(dst));
    GGML_ASSERT(ggml_is_contiguous(a));

    // parallelize by elements
    const int ne = (int)ggml_nelements(dst);
    const int dr = (ne + nth - 1) / nth;
    const int ie0 = dr * ith;
    const int ie1 = MIN(ie0 + dr, ne);

    for (int i = ie0; i < ie1; ++i) {
        dst_data[i] = a_data[i] * 2;
    }
}